

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall EventLoop::handleRead(EventLoop *this)

{
  ssize_t sVar1;
  LogStream *this_00;
  LogStream *str;
  element_type *this_01;
  size_t in_RDI;
  ssize_t n;
  uint64_t one;
  char *in_stack_ffffffffffffefd8;
  Logger *in_stack_ffffffffffffefe0;
  void *in_stack_fffffffffffff000;
  int in_stack_fffffffffffff00c;
  Logger *in_stack_fffffffffffff020;
  
  sVar1 = readn(in_stack_fffffffffffff00c,in_stack_fffffffffffff000,in_RDI);
  if (sVar1 != 8) {
    Logger::Logger(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8,0);
    Logger::stream((Logger *)&stack0xfffffffffffff010);
    this_00 = LogStream::operator<<
                        ((LogStream *)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
    str = LogStream::operator<<(this_00,(long)in_stack_ffffffffffffefd8);
    LogStream::operator<<(this_00,(char *)str);
    Logger::~Logger(in_stack_fffffffffffff020);
  }
  this_01 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x109196);
  Channel::setEvents(this_01,0x80000001);
  return;
}

Assistant:

void EventLoop::handleRead(){
    uint64_t one = 1;
    ssize_t n=readn(wakeupFd_, &one, sizeof one);
    if(n!=sizeof one){
        LOG<<"EventLoop::handleRead() reads"<<n<<" bytes instead of 8";
    }
    // pwakeupChannel_->setEvents(EPOLLIN | EPOLLET | EPOLLONESHOT);
    pwakeupChannel_->setEvents(EPOLLIN|EPOLLET);
}